

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

String * __thiscall
kj::Path::parent::anon_class_1_0_00000001::operator()
          (String *__return_storage_ptr__,anon_class_1_0_00000001 *this,Element p)

{
  String *pSVar1;
  Element p_local;
  anon_class_1_0_00000001 *this_local;
  
  pSVar1 = mv<kj::String>(p);
  String::String(__return_storage_ptr__,pSVar1);
  return __return_storage_ptr__;
}

Assistant:

String PathPtr::toString(bool absolute) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    return absolute ? kj::str("/") : kj::str(".");
  }

  size_t size = absolute + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = kj::heapString(size);

  char* ptr = result.begin();
  bool leadingSlash = absolute;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '/';
    leadingSlash = true;
    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  }
  KJ_ASSERT(ptr == result.end());

  return result;
}